

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

bool __thiscall S2Builder::EdgeChainSimplifier::IsInterior(EdgeChainSimplifier *this,VertexId v)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  iterator iVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  int *piVar6;
  pointer ppVar7;
  ulong uVar8;
  int *piVar9;
  Iterator __begin1;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  Iterator __end1;
  int iVar15;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  bool bVar16;
  bool bVar17;
  int iVar18;
  bool bVar19;
  EdgeId e_1;
  EdgeId e;
  int local_40;
  int local_3c [3];
  
  piVar4 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar10 = piVar4[v];
  iVar13 = piVar4[(long)v + 1];
  if (((iVar13 == iVar10) ||
      (piVar4 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start, iVar13 - iVar10 != piVar4[(long)v + 1] - piVar4[v]
      )) || (v < this->builder_->num_forced_sites_)) {
    bVar19 = false;
  }
  else {
    piVar4 = (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar4) {
      (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar4;
    }
    for (; iVar13 != iVar10; iVar10 = iVar10 + 1) {
      iVar5._M_current =
           (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_3c[0] = iVar10;
      if (iVar5._M_current ==
          (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->tmp_edges_,iVar5,local_3c);
      }
      else {
        *iVar5._M_current = iVar10;
        (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
    }
    piVar4 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = piVar4[v];
    iVar13 = piVar4[(long)v + 1];
    if (iVar10 != iVar13) {
      piVar4 = (this->in_).in_edge_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar12 = (long)iVar10 << 2;
      do {
        local_40 = *(int *)((long)piVar4 + lVar12);
        iVar5._M_current =
             (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->tmp_edges_,iVar5,&local_40);
        }
        else {
          *iVar5._M_current = local_40;
          (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        lVar12 = lVar12 + 4;
      } while ((long)iVar13 * 4 != lVar12);
    }
    __first._M_current =
         (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      uVar8 = (long)__last._M_current - (long)__first._M_current >> 2;
      lVar12 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::EdgeChainSimplifier::IsInterior(int)::__0>>
                (__first,__last,(ulong)(((uint)lVar12 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1536:41)>
                  )this);
      if ((long)__last._M_current - (long)__first._M_current < 0x41) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::EdgeChainSimplifier::IsInterior(int)::__0>>
                  (__first,__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1536:41)>
                    )this);
      }
      else {
        __last_00._M_current = __first._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::EdgeChainSimplifier::IsInterior(int)::__0>>
                  (__first,__last_00,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1536:41)>
                    )this);
        if (__last_00._M_current != __last._M_current) {
          piVar4 = (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar10 = *__last_00._M_current;
            lVar12 = (long)__last_00._M_current[-1];
            piVar9 = __last_00._M_current;
            if (piVar4[iVar10] < piVar4[lVar12]) {
              do {
                *piVar9 = (int)lVar12;
                lVar12 = (long)piVar9[-2];
                piVar9 = piVar9 + -1;
              } while (piVar4[iVar10] < piVar4[lVar12]);
            }
            *piVar9 = iVar10;
            __last_00._M_current = __last_00._M_current + 1;
          } while (__last_00._M_current != __last._M_current);
        }
      }
    }
    piVar9 = (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->tmp_edges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar4 = (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = -1;
    bVar16 = false;
    bVar17 = false;
    iVar13 = -1;
    while (bVar19 = piVar9 == piVar6, !bVar19) {
      iVar1 = *piVar9;
      iVar14 = 0;
      iVar11 = 0;
      iVar15 = 0;
      iVar18 = 0;
      do {
        iVar2 = *piVar9;
        if (piVar4[iVar2] != piVar4[iVar1]) break;
        ppVar7 = (this->g_->edges_->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        iVar3 = ppVar7[iVar2].first;
        iVar2 = ppVar7[iVar2].second;
        if (iVar3 == v) {
          iVar18 = iVar18 + 1;
          if (iVar2 == v) {
            iVar14 = iVar14 + 1;
          }
          else {
            if (iVar13 < 0) {
              iVar13 = iVar2;
            }
            if (iVar13 == iVar2) {
              iVar11 = iVar11 + 1;
            }
            else {
              if (iVar10 < 0) {
                iVar10 = iVar2;
              }
              if (iVar10 != iVar2) {
                bVar16 = true;
              }
              iVar15 = iVar15 + (uint)(iVar10 == iVar2);
              bVar17 = bVar16;
            }
          }
        }
        if (iVar2 == v) {
          iVar18 = iVar18 + -1;
          if (iVar3 == v) {
            iVar14 = iVar14 + 1;
          }
          else {
            if (iVar13 < 0) {
              iVar13 = iVar3;
            }
            if (iVar13 == iVar3) {
              iVar11 = iVar11 + 1;
            }
            else {
              if (iVar10 < 0) {
                iVar10 = iVar3;
              }
              if (iVar10 != iVar3) {
                bVar17 = true;
              }
              iVar15 = iVar15 + (uint)(iVar10 == iVar3);
              bVar16 = bVar17;
            }
          }
        }
        piVar9 = piVar9 + 1;
      } while (piVar9 != piVar6);
      if (bVar17) {
        return bVar19;
      }
      if (iVar18 != 0) {
        return bVar19;
      }
      if (iVar11 != iVar15) {
        return bVar19;
      }
      if ((iVar11 < 1) && (iVar14 != 0)) {
        return bVar19;
      }
    }
  }
  return bVar19;
}

Assistant:

void S2Builder::CollectSiteEdges(const S2PointIndex<SiteId>& site_index) {
  // Find all points whose distance is <= edge_site_query_radius_ca_.
  S2ClosestPointQueryOptions options;
  options.set_conservative_max_distance(edge_site_query_radius_ca_);
  S2ClosestPointQuery<SiteId> site_query(&site_index, options);
  vector<S2ClosestPointQuery<SiteId>::Result> results;
  edge_sites_.resize(input_edges_.size());
  for (InputEdgeId e = 0; e < input_edges_.size(); ++e) {
    const InputEdge& edge = input_edges_[e];
    const S2Point& v0 = input_vertices_[edge.first];
    const S2Point& v1 = input_vertices_[edge.second];
    if (s2builder_verbose) {
      std::cout << "S2Polyline: " << s2textformat::ToString(v0)
                << ", " << s2textformat::ToString(v1) << "\n";
    }
    S2ClosestPointQueryEdgeTarget target(v0, v1);
    site_query.FindClosestPoints(&target, &results);
    auto* sites = &edge_sites_[e];
    sites->reserve(results.size());
    for (const auto& result : results) {
      sites->push_back(result.data());
      if (!snapping_needed_ &&
          result.distance() < min_edge_site_separation_ca_limit_ &&
          result.point() != v0 && result.point() != v1 &&
          s2pred::CompareEdgeDistance(result.point(), v0, v1,
                                      min_edge_site_separation_ca_) < 0) {
        snapping_needed_ = true;
      }
    }
    SortSitesByDistance(v0, sites);
  }
}